

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.cpp
# Opt level: O0

Vector2f __thiscall Rml::Box::GetSize(Box *this,BoxArea area)

{
  code *pcVar1;
  bool bVar2;
  BoxArea local_20;
  int i;
  BoxArea area_local;
  Box *this_local;
  Vector2f area_size;
  
  if ((area == Auto) &&
     (bVar2 = Assert("RMLUI_ASSERT(area != BoxArea::Auto)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Box.cpp"
                     ,0x3b), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  this_local = *(Box **)&this->content;
  for (local_20 = area; (int)local_20 < 3; local_20 = local_20 + Border) {
    this_local = (Box *)CONCAT44(this->area_edges[(int)local_20][0] +
                                 this->area_edges[(int)local_20][2] + this_local._4_4_,
                                 this->area_edges[(int)local_20][3] +
                                 this->area_edges[(int)local_20][1] + this_local._0_4_);
  }
  return (Vector2f)this_local;
}

Assistant:

Vector2f Box::GetSize(BoxArea area) const
{
	RMLUI_ASSERT(area != BoxArea::Auto);
	Vector2f area_size(content);
	for (int i = (int)area; i <= (int)BoxArea::Padding; i++)
	{
		area_size.x += (area_edges[i][(int)BoxEdge::Left] + area_edges[i][(int)BoxEdge::Right]);
		area_size.y += (area_edges[i][(int)BoxEdge::Top] + area_edges[i][(int)BoxEdge::Bottom]);
	}

	return area_size;
}